

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

size_t __thiscall
proto2_unittest::TestHugeFieldNumbersLite::ByteSizeLong(TestHugeFieldNumbersLite *this)

{
  RepeatedField<int> *value;
  int iVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  const_iterator __begin2;
  
  sVar4 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  value = &(this->field_0)._impl_.repeated_int32_;
  sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(value);
  uVar3 = google::protobuf::RepeatedField<int>::size(value);
  sVar6 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_int32_,5,
                     &(this->field_0)._impl_._packed_int32_cached_byte_size_);
  sVar4 = sVar5 + sVar4 + sVar6 + ((ulong)*(uint *)((long)&this->field_0 + 0x48) + (ulong)uVar3) * 5
  ;
  google::protobuf::internal::UntypedMapBase::begin
            (&__begin2.super_UntypedMapIterator,
             (UntypedMapBase *)&(this->field_0)._impl_.string_string_map_);
  while (__begin2.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
    sVar5 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (__begin2.super_UntypedMapIterator.node_ + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (__begin2.super_UntypedMapIterator.node_ + 5));
    sVar4 = sVar4 + sVar5;
    google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin2.super_UntypedMapIterator);
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar3 & 0x7f) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar4 = sVar4 + sVar5 + 5;
    }
    if ((uVar3 & 2) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar4 = sVar4 + sVar5 + 5;
    }
    if ((uVar3 & 4) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ForeignMessageLite>
                        ((this->field_0)._impl_.optional_message_);
      sVar4 = sVar4 + sVar5 + 5;
    }
    if ((uVar3 & 8) != 0) {
      sVar5 = TestHugeFieldNumbersLite_OptionalGroup::ByteSizeLong
                        ((this->field_0)._impl_.optionalgroup_);
      sVar4 = sVar4 + sVar5 + 10;
    }
    if ((uVar3 & 0x10) != 0) {
      uVar7 = (long)(this->field_0)._impl_.optional_int32_ | 1;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 5;
    }
    if ((uVar3 & 0x20) != 0) {
      uVar7 = (long)(this->field_0)._impl_.fixed_32_ | 1;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 5;
    }
    if ((uVar3 & 0x40) != 0) {
      uVar7 = (long)(this->field_0)._impl_.optional_enum_ | 1;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 5;
    }
  }
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 0x1ffffc7b:
    uVar3 = *(uint *)((long)&this->field_0 + 0x98) | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar4 = sVar4 + (iVar1 * 9 + 0x49U >> 6) + 5;
    goto switchD_0018d813_default;
  case 0x1ffffc7c:
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>
                      ((this->field_0)._impl_.oneof_field_.oneof_test_all_types_);
    break;
  case 0x1ffffc7d:
  case 0x1ffffc7e:
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize
                      ((string *)
                       ((ulong)(this->field_0)._impl_.oneof_field_.oneof_test_all_types_ &
                       0xfffffffffffffffc));
    break;
  default:
    goto switchD_0018d813_default;
  }
  sVar4 = sVar4 + sVar5 + 5;
switchD_0018d813_default:
  uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar7 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar4 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar4;
  }
  return sVar4;
}

Assistant:

::size_t TestHugeFieldNumbersLite::ByteSizeLong() const {
  const TestHugeFieldNumbersLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 536870002;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_repeated_int32());
      ::size_t tag_size = ::size_t{5} *
          ::_pbi::FromIntSize(this_._internal_repeated_int32_size());
      total_size += tag_size + data_size;
    }
    // repeated int32 packed_int32 = 536870003 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32(), 5,
              this_._impl_._packed_int32_cached_byte_size_);
    }
    // map<string, string> string_string_map = 536870010;
    {
      total_size +=
          5 * ::google::protobuf::internal::FromIntSize(this_._internal_string_string_map_size());
      for (const auto& entry : this_._internal_string_string_map()) {
        total_size += _pbi::MapEntryFuncs<std::string, std::string,
                                       _pbi::WireFormatLite::TYPE_STRING,
                                       _pbi::WireFormatLite::TYPE_STRING>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // string optional_string = 536870005;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // bytes optional_bytes = 536870006;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // .proto2_unittest.ForeignMessageLite optional_message = 536870007;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 5 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_message_);
    }
    // .proto2_unittest.TestHugeFieldNumbersLite.OptionalGroup optionalgroup = 536870008 [features = {
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 10 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
    // int32 optional_int32 = 536870000;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 5 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32());
    }
    // int32 fixed_32 = 536870001;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 5 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_fixed_32());
    }
    // .proto2_unittest.ForeignEnumLite optional_enum = 536870004;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 5 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_enum());
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 536870011;
    case kOneofUint32: {
      total_size += 5 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .proto2_unittest.TestAllTypesLite oneof_test_all_types = 536870012;
    case kOneofTestAllTypes: {
      total_size += 5 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_test_all_types_);
      break;
    }
    // string oneof_string = 536870013;
    case kOneofString: {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // bytes oneof_bytes = 536870014;
    case kOneofBytes: {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_oneof_bytes());
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}